

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletocsv.cpp
# Opt level: O3

void ensembletocsv::doit(void)

{
  size_t sVar1;
  Ensemble q;
  uint local_20;
  uint local_1c;
  
  puts("sidx, ensemble_id");
  sVar1 = fread(&local_20,8,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d, %d\n",(ulong)local_20,(ulong)local_1c);
      sVar1 = fread(&local_20,8,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit() {

    printf("sidx, ensemble_id\n");

    Ensemble q;
    size_t i = fread(&q, sizeof(q), 1, stdin);
    while (i != 0) {
      printf("%d, %d\n", q.sidx, q.ensemble_id);
      i = fread(&q, sizeof(q), 1, stdin);
    }

  }